

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O1

aiMaterial * __thiscall Assimp::SkeletonMeshBuilder::CreateMaterial(SkeletonMeshBuilder *this)

{
  long *plVar1;
  aiMaterial *this_00;
  size_t __n;
  int no_cull;
  aiString matName;
  long *local_448;
  ulong local_440;
  long local_438 [2];
  aiString local_424;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_448 = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"SkeletonMaterial","");
  plVar1 = local_448;
  __n = 0x3ff;
  if ((local_440 & 0xfffffc00) == 0) {
    __n = local_440 & 0xffffffff;
  }
  local_424.length = (ai_uint32)__n;
  memcpy(local_424.data,local_448,__n);
  local_424.data[__n] = '\0';
  if (plVar1 != local_438) {
    operator_delete(plVar1,local_438[0] + 1);
  }
  aiMaterial::AddProperty(this_00,&local_424,"?mat.name",0,0);
  local_448 = (long *)CONCAT44(local_448._4_4_,1);
  aiMaterial::AddBinaryProperty(this_00,&local_448,4,"$mat.twosided",0,0,aiPTI_Integer);
  return this_00;
}

Assistant:

aiMaterial* SkeletonMeshBuilder::CreateMaterial()
{
    aiMaterial* matHelper = new aiMaterial;

    // Name
    aiString matName( std::string( "SkeletonMaterial"));
    matHelper->AddProperty( &matName, AI_MATKEY_NAME);

    // Prevent backface culling
    const int no_cull = 1;
    matHelper->AddProperty(&no_cull,1,AI_MATKEY_TWOSIDED);

    return matHelper;
}